

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::
PlainTemplatedInternal<duckdb::string_t,duckdb::StringParquetValueConversion,false,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  long lVar1;
  idx_t row_idx;
  undefined8 *puVar2;
  ulong uVar3;
  string_t sVar4;
  
  lVar1 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  uVar3 = num_values + result_offset;
  puVar2 = (undefined8 *)(lVar1 + result_offset * 0x10 + 8);
  for (; result_offset < uVar3; result_offset = result_offset + 1) {
    sVar4 = StringParquetValueConversion::PlainRead<true>(plain_data,this);
    puVar2[-1] = sVar4.value._0_8_;
    *puVar2 = sVar4.value._8_8_;
    puVar2 = puVar2 + 2;
  }
  return;
}

Assistant:

void PlainTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines, const uint64_t num_values,
	                            const idx_t result_offset, Vector &result) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		if (!HAS_DEFINES && !CHECKED && CONVERSION::PlainConstantSize() == sizeof(VALUE_TYPE)) {
			// we can memcpy
			idx_t copy_count = num_values * CONVERSION::PlainConstantSize();
			memcpy(result_ptr + result_offset, plain_data.ptr, copy_count);
			plain_data.unsafe_inc(copy_count);
			return;
		}
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = result_offset; row_idx < result_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				result_mask.SetInvalid(row_idx);
				continue;
			}
			result_ptr[row_idx] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
		}
	}